

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O1

TFad<6,_double> * __thiscall
TPZTensor<TFad<6,_double>_>::J2
          (TFad<6,_double> *__return_storage_ptr__,TPZTensor<TFad<6,_double>_> *this)

{
  undefined8 *puVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 *puVar5;
  long lVar6;
  TFad<6,_double> *pTVar7;
  ulong uVar8;
  int i;
  value_type vVar9;
  value_type vVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  TPZVec<TFad<6,_double>_> s;
  TFad<6,_double> value;
  TPZVec<TFad<6,_double>_> local_158;
  TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>
  local_138;
  double local_128;
  TFad<6,_double> *local_118;
  undefined **local_110;
  double local_108;
  double local_100 [6];
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_d0;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_c0;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_b0;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_a0;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_90;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_> local_80;
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  local_70;
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  local_60;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  local_50;
  TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>
  local_40;
  
  local_158._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01862b38;
  local_158.fStore = (TFad<6,_double> *)0x0;
  puVar5 = (undefined8 *)operator_new__(200);
  *puVar5 = 3;
  lVar6 = 0x10;
  do {
    *(undefined ***)((long)puVar5 + lVar6 + -8) = &PTR__TFad_0185d2b8;
    *(undefined8 *)((long)puVar5 + lVar6) = 0;
    ((undefined8 *)((long)puVar5 + lVar6))[1] = 0;
    puVar1 = (undefined8 *)((long)puVar5 + lVar6 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)puVar5 + lVar6 + 0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)puVar5 + lVar6 + 0x30) = 0;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0xd0);
  local_158.fStore = (TFad<6,_double> *)(puVar5 + 1);
  local_158.fNElements = 3;
  local_158.fNAlloc = 3;
  TPZTensor<TFad<6,double>>::DeviatoricDiagonal_T<TFad<6,double>>(this,&local_158);
  local_80.fadexpr_.left_ = (TFadExpr<TFadUnaryMin<TFad<6,_double>_>_> *)&local_118;
  local_118 = local_158.fStore;
  local_a0.fadexpr_.left_ = local_158.fStore + 1;
  local_70.fadexpr_.left_ = &local_80;
  local_70.fadexpr_.right_ = &local_90;
  local_90.fadexpr_.left_ = local_158.fStore;
  local_a0.fadexpr_.right_ = local_158.fStore + 2;
  local_60.fadexpr_.left_ = &local_70;
  local_60.fadexpr_.right_ = &local_a0;
  local_50.fadexpr_.left_ = &local_60;
  local_d0.fadexpr_.left_ = (this->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_b0.fadexpr_.left_ = local_d0.fadexpr_.left_ + 1;
  local_50.fadexpr_.right_ = &local_b0;
  local_40.left_ = &local_50;
  local_c0.fadexpr_.left_ = local_d0.fadexpr_.left_ + 2;
  local_40.right_ = &local_c0;
  local_138.left_ =
       (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
        *)&local_40;
  local_d0.fadexpr_.left_ = local_d0.fadexpr_.left_ + 4;
  local_138.right_ = &local_d0;
  local_110 = &PTR__TFad_0185d2b8;
  local_d0.fadexpr_.right_ = local_d0.fadexpr_.left_;
  local_c0.fadexpr_.right_ = local_c0.fadexpr_.left_;
  local_b0.fadexpr_.right_ = local_b0.fadexpr_.left_;
  local_90.fadexpr_.right_ = local_a0.fadexpr_.right_;
  local_80.fadexpr_.right_ = local_a0.fadexpr_.left_;
  vVar9 = TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>
          ::val((TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>
                 *)local_138.left_);
  local_128 = vVar9 + (((local_138.right_)->fadexpr_).left_)->val_ *
                      (((local_138.right_)->fadexpr_).right_)->val_;
  lVar6 = 0;
  local_108 = local_128;
  do {
    vVar10 = TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>
             ::dx(&local_138,(int)lVar6);
    local_100[lVar6] = vVar10;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  if ((local_128 < 0.0) && (ABS(local_128) < 1e-12)) {
    local_108 = 0.0;
  }
  (__return_storage_ptr__->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
  __return_storage_ptr__->dx_[0] = local_100[0];
  __return_storage_ptr__->dx_[1] = local_100[1];
  __return_storage_ptr__->dx_[2] = local_100[2];
  __return_storage_ptr__->dx_[3] = local_100[3];
  __return_storage_ptr__->dx_[4] = local_100[4];
  __return_storage_ptr__->dx_[5] = local_100[5];
  __return_storage_ptr__->val_ = local_108;
  auVar4 = _DAT_014f8350;
  auVar3 = _DAT_014f8340;
  local_158._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01862b38;
  if (local_158.fStore != (TFad<6,_double> *)0x0) {
    dVar2 = local_158.fStore[-1].dx_[5];
    if (dVar2 != 0.0) {
      uVar8 = (long)dVar2 + 0x3ffffffffffffffU & 0x3ffffffffffffff;
      auVar11._8_4_ = (int)uVar8;
      auVar11._0_8_ = uVar8;
      auVar11._12_4_ = (int)(uVar8 >> 0x20);
      pTVar7 = local_158.fStore + (long)dVar2 + -1;
      lVar6 = 0;
      auVar11 = auVar11 ^ _DAT_014f8350;
      do {
        auVar12._8_4_ = (int)lVar6;
        auVar12._0_8_ = lVar6;
        auVar12._12_4_ = (int)((ulong)lVar6 >> 0x20);
        auVar12 = (auVar12 | auVar3) ^ auVar4;
        if ((bool)(~(auVar12._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar12._0_4_ ||
                    auVar11._4_4_ < auVar12._4_4_) & 1)) {
          (pTVar7->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
        }
        if ((auVar12._12_4_ != auVar11._12_4_ || auVar12._8_4_ <= auVar11._8_4_) &&
            auVar12._12_4_ <= auVar11._12_4_) {
          pTVar7[-1].super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
        }
        lVar6 = lVar6 + 2;
        pTVar7 = pTVar7 + -2;
      } while ((uVar8 - ((uint)((long)dVar2 + 0x3ffffffffffffffU) & 1)) + 2 != lVar6);
    }
    operator_delete__(local_158.fStore[-1].dx_ + 5,(long)dVar2 << 6 | 8);
  }
  return __return_storage_ptr__;
}

Assistant:

T TPZTensor<T>::J2() const {
    TPZVec<T> s(3);
    DeviatoricDiagonal_T<T>(s);
    T value = -s[0] * s[1] - s[0] * s[2] - s[1] * s[2] + fData[_XY_] * fData[_XY_] + fData[_XZ_] * fData[_XZ_] + fData[_YZ_] * fData[_YZ_];
    return TPZAssert::NonNegative(value);
}